

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O1

void Bdc_SpfdDecomposeTest8(void)

{
  word *pwVar1;
  ulong uVar2;
  word wVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Wrd_t *pVVar7;
  int iVar8;
  long lVar9;
  word t;
  timespec ts;
  word FuncBest;
  Vec_Int_t *vWeights;
  word local_60;
  timespec local_58;
  long local_48;
  ulong local_40;
  Vec_Int_t *local_38;
  
  local_60 = 0x513b57150819050f;
  iVar4 = clock_gettime(3,&local_58);
  lVar9 = -1;
  local_48 = -1;
  if (-1 < iVar4) {
    local_48 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  pVVar7 = Bdc_SpfdReadFiles5(&local_38);
  uVar5 = Bdc_SpfdAdjCost(local_60);
  printf("Best init = %4d.  ",(ulong)uVar5);
  Extra_PrintHex(_stdout,(uint *)&local_60,6);
  iVar8 = 3;
  iVar4 = clock_gettime(3,&local_58);
  if (-1 < iVar4) {
    lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  lVar9 = lVar9 - local_48;
  Abc_Print(iVar8,"%s =","  Time");
  Abc_Print(iVar8,"%9.2f sec\n",(double)lVar9 / 1000000.0);
  wVar3 = local_60;
  iVar4 = pVVar7->nSize;
  if ((long)iVar4 < 1) {
    uVar5 = 1000000000;
  }
  else {
    pwVar1 = pVVar7->pArray;
    uVar5 = 1000000000;
    lVar9 = 0;
    do {
      uVar2 = pwVar1[lVar9];
      uVar6 = Bdc_SpfdAdjCost(wVar3 ^ uVar2);
      if ((int)uVar6 < (int)uVar5) {
        uVar5 = uVar6;
        local_40 = uVar2;
      }
      lVar9 = lVar9 + 1;
    } while (iVar4 != lVar9);
  }
  printf("Best cost = %4d.  ",(ulong)uVar5);
  Extra_PrintHex(_stdout,(uint *)&local_40,6);
  iVar8 = 3;
  iVar4 = clock_gettime(3,&local_58);
  if (iVar4 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  lVar9 = lVar9 - local_48;
  Abc_Print(iVar8,"%s =","  Time");
  Abc_Print(iVar8,"%9.2f sec\n",(double)lVar9 / 1000000.0);
  Abc_Show6VarFunc(0,local_60);
  Abc_Show6VarFunc(0,local_40);
  Abc_Show6VarFunc(0,local_60 ^ local_40);
  local_40 = local_40 ^ local_60;
  Extra_PrintHex(_stdout,(uint *)&local_40,6);
  putchar(10);
  return;
}

Assistant:

void Bdc_SpfdDecomposeTest8()
{
//    word t = 0x9ef7a8d9c7193a0f;
//    word t = 0x9EF7FDBFC77F6F0F;
    word t = ABC_CONST(0x513B57150819050F);

    Vec_Int_t * vWeights;
    Vec_Wrd_t * vDivs;
    word Func, FuncBest;
    int Cost, CostBest = ABC_INFINITY;
    int i;
    abctime clk = Abc_Clock();

//    return;

    vDivs = Bdc_SpfdReadFiles5( &vWeights );

    printf( "Best init = %4d.  ", Bdc_SpfdAdjCost(t) );
    Extra_PrintHex( stdout, (unsigned *)&t, 6 ); //printf( "\n" );
    Abc_PrintTime( 1, "  Time", Abc_Clock() - clk );

    Vec_WrdForEachEntry( vDivs, Func, i )
    {
        Cost = Bdc_SpfdAdjCost( t ^ Func );
        if ( CostBest > Cost )
        {
            CostBest = Cost;
            FuncBest = Func;
        }
    }

    printf( "Best cost = %4d.  ", CostBest );
    Extra_PrintHex( stdout, (unsigned *)&FuncBest, 6 ); //printf( "\n" );
    Abc_PrintTime( 1, "  Time", Abc_Clock() - clk );

Abc_Show6VarFunc( 0, t );
Abc_Show6VarFunc( 0, FuncBest );
Abc_Show6VarFunc( 0, (FuncBest ^ t) );

    FuncBest ^= t;
    Extra_PrintHex( stdout, (unsigned *)&FuncBest, 6 ); printf( "\n" );

}